

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseFulfillerPair<capnp::AnyPointer::Pipeline> *
kj::newPromiseAndFulfiller<capnp::AnyPointer::Pipeline>(void)

{
  RefOrVoid<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_> params;
  Own<kj::_::PromiseNode> *pOVar1;
  Pipeline *pPVar2;
  Promise<capnp::AnyPointer::Pipeline> *pPVar3;
  Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_> *other;
  PromiseFulfillerPair<capnp::AnyPointer::Pipeline> *in_RDI;
  void *local_68;
  undefined1 local_60 [8];
  ReducePromises<capnp::AnyPointer::Pipeline> promise;
  Own<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>_>
  local_40;
  undefined1 local_30 [8];
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_> wrapper;
  
  _::WeakFulfiller<capnp::AnyPointer::Pipeline>::make();
  params = Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_>::operator*
                     ((Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_> *)&intermediate.ptr);
  heap<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>>,kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>&>
            ((kj *)&local_40,params);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>>,void>
            ((Own<kj::_::PromiseNode> *)local_30,&local_40);
  Own<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>_>
  ::~Own(&local_40);
  pOVar1 = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)local_30);
  local_68 = (void *)0x0;
  pPVar2 = implicitCast<capnp::AnyPointer::Pipeline*,decltype(nullptr)>(&local_68);
  pOVar1 = _::maybeChain<capnp::AnyPointer::Pipeline>(pOVar1,pPVar2);
  Promise<capnp::AnyPointer::Pipeline>::Promise
            ((Promise<capnp::AnyPointer::Pipeline> *)local_60,false,pOVar1);
  pPVar3 = mv<kj::Promise<capnp::AnyPointer::Pipeline>>
                     ((Promise<capnp::AnyPointer::Pipeline> *)local_60);
  Promise<capnp::AnyPointer::Pipeline>::Promise(&in_RDI->promise,pPVar3);
  other = mv<kj::Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>>>
                    ((Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_> *)&intermediate.ptr);
  Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>>::
  Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>,void>
            ((Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>> *)&in_RDI->fulfiller,other);
  Promise<capnp::AnyPointer::Pipeline>::~Promise((Promise<capnp::AnyPointer::Pipeline> *)local_60);
  Own<kj::_::PromiseNode>::~Own((Own<kj::_::PromiseNode> *)local_30);
  Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_>::~Own
            ((Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_> *)&intermediate.ptr);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}